

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O1

BIGNUM * BN_bin2bn(uchar *s,int len,BIGNUM *ret)

{
  BIGNUM *a;
  BIGNUM *pBVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint words;
  uchar *puVar7;
  uint uVar8;
  bool bVar9;
  ulong uVar6;
  
  if (ret == (BIGNUM *)0x0) {
    a = (BIGNUM *)CRYPTO_zalloc(0x18);
    if (a != (BIGNUM *)0x0) {
      a->flags = 1;
      ret = a;
      goto LAB_0011264f;
    }
    ret = (BIGNUM *)0x0;
  }
  a = (BIGNUM *)0x0;
LAB_0011264f:
  if (ret != (BIGNUM *)0x0) {
    if (0 < len) {
      puVar7 = s + (uint)len;
      do {
        if (*s != '\0') goto LAB_00112682;
        s = s + 1;
        bVar9 = 1 < len;
        len = len + -1;
      } while (bVar9);
      len = 0;
      s = puVar7;
    }
LAB_00112682:
    if (len == 0) {
      ret->top = 0;
      return ret;
    }
    uVar8 = len - 1U >> 3;
    uVar5 = (ulong)uVar8;
    words = uVar8 + 1;
    uVar6 = (ulong)words;
    if (((int)uVar8 < ret->dmax) || (pBVar1 = bn_expand2(ret,words), pBVar1 != (BIGNUM *)0x0)) {
      uVar8 = len - 1U & 7;
      ret->top = words;
      ret->neg = 0;
      lVar2 = 0;
      uVar3 = 0;
      do {
        uVar3 = (ulong)s[lVar2] | uVar3 << 8;
        bVar9 = uVar8 == 0;
        uVar8 = uVar8 - 1;
        if (bVar9) {
          uVar6 = (ulong)((int)uVar6 - 1);
          ret->d[uVar6] = uVar3;
          uVar8 = 7;
          uVar3 = 0;
        }
        lVar2 = lVar2 + 1;
      } while (len != (int)lVar2);
      do {
        if (ret->d[uVar5] != 0) {
          iVar4 = (int)uVar5 + 1;
          goto LAB_00112723;
        }
        uVar5 = uVar5 - 1;
      } while (1 < (int)uVar5 + 2);
      iVar4 = 0;
LAB_00112723:
      ret->top = iVar4;
      if (iVar4 != 0) {
        return ret;
      }
      ret->neg = 0;
      return ret;
    }
    BN_free(a);
  }
  return (BIGNUM *)0x0;
}

Assistant:

BIGNUM *BN_bin2bn(const unsigned char *s, int len, BIGNUM *ret)
{
    unsigned int i, m;
    unsigned int n;
    BN_ULONG l;
    BIGNUM *bn = NULL;

    if (ret == NULL)
        ret = bn = BN_new();
    if (ret == NULL)
        return (NULL);
    bn_check_top(ret);
    /* Skip leading zero's. */
    for ( ; len > 0 && *s == 0; s++, len--)
        continue;
    n = len;
    if (n == 0) {
        ret->top = 0;
        return (ret);
    }
    i = ((n - 1) / BN_BYTES) + 1;
    m = ((n - 1) % (BN_BYTES));
    if (bn_wexpand(ret, (int)i) == NULL) {
        BN_free(bn);
        return NULL;
    }
    ret->top = i;
    ret->neg = 0;
    l = 0;
    while (n--) {
        l = (l << 8L) | *(s++);
        if (m-- == 0) {
            ret->d[--i] = l;
            l = 0;
            m = BN_BYTES - 1;
        }
    }
    /*
     * need to call this due to clear byte at top if avoiding having the top
     * bit set (-ve number)
     */
    bn_correct_top(ret);
    return (ret);
}